

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int Cudd_ShuffleHeap(DdManager *table,int *permutation)

{
  uint uVar1;
  MtrNode *treenode;
  int iVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  int *invperm;
  ulong uVar6;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)table->size;
  if (table->size < 1) {
    uVar5 = uVar6;
  }
  do {
    if (uVar5 == uVar6) {
      return 1;
    }
    piVar3 = permutation + uVar6;
    piVar4 = table->invperm + uVar6;
    uVar6 = uVar6 + 1;
  } while (*piVar3 == *piVar4);
  iVar2 = ddReorderPreprocess(table);
  if (iVar2 != 0) {
    if (table->peakLiveNodes < table->keys) {
      table->peakLiveNodes = table->keys;
    }
    uVar1 = table->size;
    piVar3 = (int *)malloc((long)(int)uVar1 << 2);
    piVar4 = (int *)0x0;
    invperm = (int *)0x0;
    if (0 < (int)uVar1) {
      invperm = (int *)(ulong)uVar1;
    }
    for (; invperm != piVar4; piVar4 = (int *)((long)piVar4 + 1)) {
      piVar3[permutation[(long)piVar4]] = (int)piVar4;
    }
    treenode = table->tree;
    iVar2 = ddCheckPermuation(table,treenode,piVar3,invperm);
    if (iVar2 == 0) {
      free(piVar3);
    }
    else {
      iVar2 = ddUpdateMtrTree(table,treenode,piVar3,invperm);
      free(piVar3);
      if (iVar2 != 0) {
        iVar2 = ddShuffle(table,permutation);
        ddReorderPostprocess(table);
        return iVar2;
      }
    }
  }
  return 0;
}

Assistant:

int
Cudd_ShuffleHeap(
  DdManager * table /* DD manager */,
  int * permutation /* required variable permutation */)
{

    int result;
    int i;
    int identity = 1;
    int *perm;

    /* Don't waste time in case of identity permutation. */
    for (i = 0; i < table->size; i++) {
        if (permutation[i] != table->invperm[i]) {
            identity = 0;
            break;
        }
    }
    if (identity == 1) {
        return(1);
    }
    if (!ddReorderPreprocess(table)) return(0);
    if (table->keys > table->peakLiveNodes) {
        table->peakLiveNodes = table->keys;
    }

    perm = ABC_ALLOC(int, table->size);
    for (i = 0; i < table->size; i++)
        perm[permutation[i]] = i;
    if (!ddCheckPermuation(table,table->tree,perm,permutation)) {
        ABC_FREE(perm);
        return(0);
    }
    if (!ddUpdateMtrTree(table,table->tree,perm,permutation)) {
        ABC_FREE(perm);
        return(0);
    }
    ABC_FREE(perm);

    result = ddShuffle(table,permutation);

    if (!ddReorderPostprocess(table)) return(0);

    return(result);

}